

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cc
# Opt level: O0

string * __thiscall board::Move::getString_abi_cxx11_(string *__return_storage_ptr__,Move *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char promotedChar;
  allocator<char> local_2b;
  undefined1 local_2a;
  char local_29;
  char local_28;
  char local_27;
  char local_26;
  undefined1 local_25;
  int iStack_24;
  char c [5];
  int promoted;
  int toSquare;
  int fromSquare;
  Move *this_local;
  string *str;
  
  iVar1 = FROMSQ(this->value);
  uVar2 = Board::SQ64[iVar1];
  iVar1 = TOSQ(this->value);
  c._1_4_ = Board::SQ64[iVar1];
  iStack_24 = PROMOTED(this->value);
  uVar3 = uVar2;
  if ((int)uVar2 < 0) {
    uVar3 = uVar2 + 7;
  }
  local_29 = ((char)uVar2 - ((byte)uVar3 & 0xf8)) + 'a';
  if ((int)uVar2 < 0) {
    uVar2 = uVar2 + 7;
  }
  local_28 = (char)(uVar2 >> 3) + '1';
  iVar1 = c._1_4_;
  if ((int)c._1_4_ < 0) {
    iVar1 = c._1_4_ + 7;
  }
  local_27 = ((char)c._1_4_ - ((byte)iVar1 & 0xf8)) + 'a';
  uVar2 = c._1_4_;
  if ((int)c._1_4_ < 0) {
    uVar2 = c._1_4_ + 7;
  }
  local_26 = (char)(uVar2 >> 3) + '1';
  local_25 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,&local_29,&local_2b);
  std::allocator<char>::~allocator(&local_2b);
  if (iStack_24 != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,Board::PIECE_CHARS[iStack_24])
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string board::Move::getString() const
{
    int fromSquare = Board::SQ64[FROMSQ(value)];
    int toSquare = Board::SQ64[TOSQ(value)];
    int promoted = PROMOTED(value);
    char c[] = {static_cast<char>((fromSquare % 8) + 'a'), static_cast<char>((fromSquare / 8) + '1'),
                static_cast<char>((toSquare % 8) + 'a'), static_cast<char>((toSquare / 8) + '1'), '\0'};
    std::string str(static_cast<char*>(c));
    if (promoted) {
        char promotedChar = Board::PIECE_CHARS[promoted];
        str += promotedChar;
    }
    return str;
}